

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.hpp
# Opt level: O2

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::
AddOne<ot::commissioner::persistent_storage::Registrar,ot::commissioner::persistent_storage::RegistrarId>
          (PersistentStorageJson *this,Registrar *aValue,RegistrarId *aRetId,string *aSeqName,
          string *aArrName)

{
  json *this_00;
  Status SVar1;
  Status SVar2;
  reference pvVar3;
  Registrar insValue;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_98;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_88;
  Registrar local_78;
  
  SVar1 = CacheFromFile(this);
  SVar2 = kError;
  if (SVar1 == kSuccess) {
    Registrar::Registrar(&local_78,aValue);
    this_00 = &this->mCache;
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(this_00,aSeqName);
    from_json(pvVar3,aRetId);
    local_98._0_4_ = aRetId->mId + 1;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json<unsigned_int,_unsigned_int,_0>(&local_88,(uint *)&local_98);
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](this_00,aSeqName);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator=(pvVar3,&local_88);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&local_88);
    local_78.mId = (RegistrarId)aRetId->mId;
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](this_00,aArrName);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    basic_json<ot::commissioner::persistent_storage::Registrar_&,_ot::commissioner::persistent_storage::Registrar,_0>
              (&local_98,&local_78);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::push_back(pvVar3,&local_98);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&local_98);
    SVar2 = CacheToFile(this);
    Registrar::~Registrar(&local_78);
  }
  return SVar2;
}

Assistant:

Status AddOne(V const &aValue, I &aRetId, std::string aSeqName, std::string aArrName)
    {
        if (CacheFromFile() != Status::kSuccess)
        {
            return Status::kError;
        }

        V insValue = aValue;
        mCache.at(aSeqName).get_to(aRetId);
        mCache[aSeqName] = aRetId.mId + 1;

        insValue.mId = aRetId;

        mCache[aArrName].push_back(insValue);

        return CacheToFile();
    }